

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBin::load(ModelBin *this,int w,int h,int c,int type)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  Allocator *unaff_retaddr;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  Mat *in_stack_00000018;
  Mat m;
  Mat *this_00;
  Mat local_58;
  
  this_00 = in_RDI;
  (**(code **)*in_RSI)(&local_58,in_RSI,in_EDX * in_ECX * in_R8D,in_R9D);
  bVar1 = Mat::empty(this_00);
  if (bVar1) {
    Mat::Mat(in_RDI,&local_58);
  }
  else {
    Mat::reshape(in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
                 unaff_retaddr);
  }
  Mat::~Mat((Mat *)0x15b3b1);
  return this_00;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}